

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_parse.c
# Opt level: O2

off_t ngx_parse_offset(ngx_str_t *line)

{
  uint uVar1;
  off_t oVar3;
  long lVar4;
  size_t n;
  long lVar5;
  long lVar6;
  ulong uVar2;
  
  n = line->len;
  lVar4 = -1;
  if (n != 0) {
    lVar6 = 0x7fffffffffffffff;
    lVar5 = 1;
    uVar1 = line->data[n - 1] - 0x47;
    uVar2 = (ulong)uVar1;
    if (uVar1 < 0x27) {
      if ((0x100000001U >> (uVar2 & 0x3f) & 1) == 0) {
        if ((0x1000000010U >> (uVar2 & 0x3f) & 1) == 0) {
          if ((0x4000000040U >> (uVar2 & 0x3f) & 1) != 0) {
            n = n - 1;
            lVar6 = 0x7ffffffffff;
            lVar5 = 0x100000;
          }
        }
        else {
          n = n - 1;
          lVar6 = 0x1fffffffffffff;
          lVar5 = 0x400;
        }
      }
      else {
        n = n - 1;
        lVar6 = 0x1ffffffff;
        lVar5 = 0x40000000;
      }
    }
    oVar3 = ngx_atoof(line->data,n);
    if (oVar3 <= lVar6 && oVar3 != -1) {
      lVar4 = oVar3 * lVar5;
    }
  }
  return lVar4;
}

Assistant:

off_t
ngx_parse_offset(ngx_str_t *line)
{
    u_char  unit;
    off_t   offset, scale, max;
    size_t  len;

    len = line->len;

    if (len == 0) {
        return NGX_ERROR;
    }

    unit = line->data[len - 1];

    switch (unit) {
    case 'K':
    case 'k':
        len--;
        max = NGX_MAX_OFF_T_VALUE / 1024;
        scale = 1024;
        break;

    case 'M':
    case 'm':
        len--;
        max = NGX_MAX_OFF_T_VALUE / (1024 * 1024);
        scale = 1024 * 1024;
        break;

    case 'G':
    case 'g':
        len--;
        max = NGX_MAX_OFF_T_VALUE / (1024 * 1024 * 1024);
        scale = 1024 * 1024 * 1024;
        break;

    default:
        max = NGX_MAX_OFF_T_VALUE;
        scale = 1;
    }

    offset = ngx_atoof(line->data, len);
    if (offset == NGX_ERROR || offset > max) {
        return NGX_ERROR;
    }

    offset *= scale;

    return offset;
}